

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_make_inter_predictor
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,
               InterPredParams *inter_pred_params,SubpelParams *subpel_params)

{
  int in_ECX;
  uint8_t *in_RDX;
  int unaff_EBX;
  ConvolveParams *unaff_RBP;
  int *in_R8;
  uint8_t *in_R9;
  uint8_t *unaff_R12;
  int unaff_R13D;
  ConvolveParams *unaff_R14;
  InterpFilterParams **unaff_R15;
  int unaff_retaddr;
  undefined4 unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_00000010;
  ConvolveParams *in_stack_00000018;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  SubpelParams *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  
  if (*in_R8 == 0) {
    if (in_R8[0x2d] == 0) {
      inter_predictor((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),
                      (int)((ulong)in_R8 >> 0x20),in_R9,
                      (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                      (SubpelParams *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c,unaff_R13D,unaff_R14,unaff_R15);
    }
    else {
      highbd_inter_predictor
                (in_RDX,in_ECX,(uint8_t *)in_R8,(int)((ulong)in_R9 >> 0x20),
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,(int)unaff_R15,unaff_RBP,
                 (InterpFilterParams **)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_00000008);
    }
  }
  else if (*in_R8 == 1) {
    av1_warp_plane((WarpedMotionParams *)CONCAT44(in_R8[0x26],in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,(uint8_t *)(in_R8 + 0xc),
                   in_stack_ffffffffffffff7c,in_R8[0x29],unaff_EBX,unaff_R12,unaff_R13D,
                   (int)unaff_R14,(int)unaff_R15,(int)unaff_RBP,unaff_retaddr,in_stack_00000008,
                   in_stack_00000010,in_stack_00000018);
  }
  return;
}

Assistant:

void av1_make_inter_predictor(const uint8_t *src, int src_stride, uint8_t *dst,
                              int dst_stride,
                              InterPredParams *inter_pred_params,
                              const SubpelParams *subpel_params) {
  assert(IMPLIES(inter_pred_params->conv_params.is_compound,
                 inter_pred_params->conv_params.dst != NULL));

  if (inter_pred_params->mode == TRANSLATION_PRED) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (inter_pred_params->use_hbd_buf) {
      highbd_inter_predictor(src, src_stride, dst, dst_stride, subpel_params,
                             inter_pred_params->block_width,
                             inter_pred_params->block_height,
                             &inter_pred_params->conv_params,
                             inter_pred_params->interp_filter_params,
                             inter_pred_params->bit_depth);
    } else {
      inter_predictor(src, src_stride, dst, dst_stride, subpel_params,
                      inter_pred_params->block_width,
                      inter_pred_params->block_height,
                      &inter_pred_params->conv_params,
                      inter_pred_params->interp_filter_params);
    }
#else
    inter_predictor(src, src_stride, dst, dst_stride, subpel_params,
                    inter_pred_params->block_width,
                    inter_pred_params->block_height,
                    &inter_pred_params->conv_params,
                    inter_pred_params->interp_filter_params);
#endif
  }
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  // TODO(jingning): av1_warp_plane() can be further cleaned up.
  else if (inter_pred_params->mode == WARP_PRED) {
    av1_warp_plane(
        &inter_pred_params->warp_params, inter_pred_params->use_hbd_buf,
        inter_pred_params->bit_depth, inter_pred_params->ref_frame_buf.buf0,
        inter_pred_params->ref_frame_buf.width,
        inter_pred_params->ref_frame_buf.height,
        inter_pred_params->ref_frame_buf.stride, dst,
        inter_pred_params->pix_col, inter_pred_params->pix_row,
        inter_pred_params->block_width, inter_pred_params->block_height,
        dst_stride, inter_pred_params->subsampling_x,
        inter_pred_params->subsampling_y, &inter_pred_params->conv_params);
  }
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  else {
    assert(0 && "Unsupported inter_pred_params->mode");
  }
}